

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placeholder_impl.cpp
# Opt level: O0

Panel __thiscall ui::panel::PlaceHolder(panel *this,string *title)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Panel PVar1;
  undefined1 local_28 [24];
  string *title_local;
  
  local_28._16_8_ = title;
  title_local = (string *)this;
  ftxui::Make<ui::PlaceHolderImpl,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<ui::PanelBase>::shared_ptr<ui::PlaceHolderImpl,void>
            ((shared_ptr<ui::PanelBase> *)this,(shared_ptr<ui::PlaceHolderImpl> *)local_28);
  std::shared_ptr<ui::PlaceHolderImpl>::~shared_ptr((shared_ptr<ui::PlaceHolderImpl> *)local_28);
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Panel)PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Panel PlaceHolder(const std::string& title) {
  return Make<PlaceHolderImpl>(title);
}